

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void SyBigEndianPack64(uchar *buf,sxu64 n64)

{
  *(sxu64 *)buf =
       n64 >> 0x38 | (n64 & 0xff000000000000) >> 0x28 | (n64 & 0xff0000000000) >> 0x18 |
       (n64 & 0xff00000000) >> 8 | (n64 & 0xff000000) << 8 | (n64 & 0xff0000) << 0x18 |
       (n64 & 0xff00) << 0x28 | n64 << 0x38;
  return;
}

Assistant:

JX9_PRIVATE void SyBigEndianPack64(unsigned char *buf,sxu64 n64)
{
	buf[7] = n64 & 0xFF; n64 >>=8;
	buf[6] = n64 & 0xFF; n64 >>=8;
	buf[5] = n64 & 0xFF; n64 >>=8;
	buf[4] = n64 & 0xFF; n64 >>=8;
	buf[3] = n64 & 0xFF; n64 >>=8;
	buf[2] = n64 & 0xFF; n64 >>=8;
	buf[1] = n64 & 0xFF; n64 >>=8;
	buf[0] = (sxu8)n64 ; 
}